

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<ProString_&,_const_ProString_&>,_ProString_&>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<ProString_&,_const_ProString_&>,_ProString_&> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ProString *pPVar4;
  ProString *pPVar5;
  char16_t *pcVar6;
  CutResult CVar7;
  char16_t *pcVar8;
  long lVar9;
  char16_t *__dest;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar4 = (this->a).a;
  pPVar5 = (this->a).b;
  if ((((pPVar4->m_string).d.ptr == (char16_t *)0x0) &&
      ((pPVar5->m_string).d.ptr == (char16_t *)0x0)) &&
     ((this->b->m_string).d.ptr == (char16_t *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00278f6e;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    iVar1 = pPVar4->m_length;
    iVar2 = pPVar5->m_length;
    iVar3 = this->b->m_length;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,(long)iVar3 + (long)iVar2 + (long)iVar1,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    pPVar4 = (this->a).a;
    lVar9 = (long)pPVar4->m_length;
    if (lVar9 != 0) {
      pcVar6 = (pPVar4->m_string).d.ptr;
      local_40 = (long)pPVar4->m_offset;
      local_48 = lVar9;
      CVar7 = QtPrivate::QContainerImplHelper::mid((pPVar4->m_string).d.size,&local_40,&local_48);
      pcVar8 = (char16_t *)0x0;
      if (CVar7 != Null) {
        pcVar8 = pcVar6 + local_40;
      }
      memcpy(__dest,pcVar8,lVar9 * 2);
      __dest = __dest + lVar9;
    }
    pPVar4 = (this->a).b;
    lVar9 = (long)pPVar4->m_length;
    if (lVar9 != 0) {
      pcVar6 = (pPVar4->m_string).d.ptr;
      local_40 = (long)pPVar4->m_offset;
      local_48 = lVar9;
      CVar7 = QtPrivate::QContainerImplHelper::mid((pPVar4->m_string).d.size,&local_40,&local_48);
      pcVar8 = (char16_t *)0x0;
      if (CVar7 != Null) {
        pcVar8 = pcVar6 + local_40;
      }
      memcpy(__dest,pcVar8,lVar9 * 2);
      __dest = __dest + lVar9;
    }
    pPVar4 = this->b;
    lVar9 = (long)pPVar4->m_length;
    if (lVar9 != 0) {
      pcVar6 = (pPVar4->m_string).d.ptr;
      local_40 = (long)pPVar4->m_offset;
      local_48 = lVar9;
      CVar7 = QtPrivate::QContainerImplHelper::mid((pPVar4->m_string).d.size,&local_40,&local_48);
      pcVar8 = (char16_t *)0x0;
      if (CVar7 != Null) {
        pcVar8 = pcVar6 + local_40;
      }
      memcpy(__dest,pcVar8,lVar9 * 2);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00278f6e:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }